

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak2.cpp
# Opt level: O2

bool Cipher::generateClusters(TParameters *params,int n,TClusters *clusters)

{
  int iVar1;
  pointer piVar2;
  mapped_type_conflict *pmVar3;
  int i;
  ulong uVar4;
  ulong uVar5;
  map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> used;
  key_type_conflict local_6c;
  TClusters *local_68;
  _Rb_tree<int,_std::pair<const_int,_bool>,_std::_Select1st<std::pair<const_int,_bool>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
  local_60;
  
  piVar2 = (clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  if ((clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  std::vector<int,_std::allocator<int>_>::resize(clusters,(long)n);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar4 = 0;
  uVar5 = (ulong)(uint)n;
  if (n < 1) {
    uVar5 = uVar4;
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  for (; uVar5 * 4 - uVar4 != 0; uVar4 = uVar4 + 4) {
    piVar2 = (params->hint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = *(int *)((long)piVar2 + uVar4);
    if (-1 < iVar1) {
      *(int *)((long)(clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start + uVar4) = iVar1;
      pmVar3 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
               operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                           *)&local_60,(key_type_conflict *)((long)piVar2 + uVar4));
      *pmVar3 = true;
    }
  }
  local_6c = 0;
  local_68 = clusters;
  for (uVar4 = 0; uVar4 != uVar5; uVar4 = uVar4 + 1) {
    if ((params->hint).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar4] < 0) {
      while (pmVar3 = std::
                      map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
                      operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                                  *)&local_60,&local_6c), *pmVar3 == true) {
        local_6c = local_6c + 1;
        if (params->maxClusters <= local_6c) {
          local_6c = 0;
        }
      }
      (local_68->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[uVar4] = local_6c;
      local_6c = local_6c + 1;
      if (params->maxClusters <= local_6c) {
        local_6c = 0;
      }
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_bool>,_std::_Select1st<std::pair<const_int,_bool>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
  ::~_Rb_tree(&local_60);
  return true;
}

Assistant:

bool generateClusters(const TParameters & params, int n, TClusters & clusters) {
        clusters.clear();
        clusters.resize(n);

        std::map<int, bool> used;
        for (int i = 0; i < n; ++i) {
            if (params.hint[i] < 0) continue;
            clusters[i] = params.hint[i];
            used[params.hint[i]] = true;
        }

        int cid = 0;
        for (int i = 0; i < n; ++i) {
            if (params.hint[i] >= 0) continue;
            //clusters[i] = rand()%params.maxClusters;
            while (used[cid]) {
                if (++cid >= params.maxClusters) cid = 0;
            }
            clusters[i] = cid;
            if (++cid >= params.maxClusters) cid = 0;
        }

        return true;
    }